

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.hh
# Opt level: O0

void __thiscall avro::detail::BufferImpl::append(BufferImpl *this,BufferImpl *src)

{
  long in_RSI;
  deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_> *in_RDI;
  _Deque_iterator<avro::detail::Chunk,_const_avro::detail::Chunk_&,_const_avro::detail::Chunk_*>
  *in_stack_00000028;
  _Deque_iterator<avro::detail::Chunk,_const_avro::detail::Chunk_&,_const_avro::detail::Chunk_*>
  *in_stack_00000030;
  back_insert_iterator<std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>_>
  in_stack_00000038;
  
  std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::begin(in_RDI);
  std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::end(in_RDI);
  std::back_inserter<std::deque<avro::detail::Chunk,std::allocator<avro::detail::Chunk>>>(in_RDI);
  std::
  copy<std::_Deque_iterator<avro::detail::Chunk,avro::detail::Chunk_const&,avro::detail::Chunk_const*>,std::back_insert_iterator<std::deque<avro::detail::Chunk,std::allocator<avro::detail::Chunk>>>>
            (in_stack_00000030,in_stack_00000028,in_stack_00000038);
  in_RDI[2].super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
  super__Deque_impl_data._M_map_size =
       *(long *)(in_RSI + 0xa8) +
       in_RDI[2].super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>.
       _M_impl.super__Deque_impl_data._M_map_size;
  return;
}

Assistant:

void append(const BufferImpl &src) {
        std::copy(src.readChunks_.begin(), src.readChunks_.end(), std::back_inserter(readChunks_));
        size_ += src.size_;
    }